

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_pivot_stmt.cpp
# Opt level: O2

vector<duckdb::unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>,_true>,_true>
* __thiscall duckdb::Transformer::GetPivotEntries(Transformer *this)

{
  for (; (this->parent).ptr != (Transformer *)0x0;
      this = optional_ptr<duckdb::Transformer,_true>::operator->(&this->parent)) {
  }
  return &this->pivot_entries;
}

Assistant:

vector<unique_ptr<Transformer::CreatePivotEntry>> &Transformer::GetPivotEntries() {
	if (parent) {
		return parent->GetPivotEntries();
	}
	return pivot_entries;
}